

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupZeroUndc(Gia_Man_t *p,char *pInit,int nNewPis,int fGiaSimple,int fVerbose)

{
  byte bVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  void *__s;
  long lVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  int iVar12;
  long lVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  
  iVar20 = p->nRegs;
  sVar6 = strlen(pInit);
  if (iVar20 != (int)sVar6) {
    __assert_fail("(int)strlen(pInit) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc39,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)");
  }
  iVar19 = p->vCis->nSize - iVar20;
  sVar6 = (long)iVar20 * 4;
  __s = malloc(sVar6);
  memset(__s,0xff,sVar6);
  if (0 < iVar20) {
    lVar7 = 0;
    do {
      if ((byte)(pInit[lVar7] | 0x20U) == 0x78) {
        *(int *)((long)__s + lVar7 * 4) = iVar19;
        iVar19 = iVar19 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (iVar20 != lVar7);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p_00->fGiaSimple = fGiaSimple;
  p->pObjs->Value = 0;
  pVVar14 = p->vCis;
  uVar15 = pVVar14->nSize;
  uVar17 = (ulong)uVar15;
  uVar4 = uVar15 - p->nRegs;
  uVar10 = (ulong)uVar4;
  if (uVar4 != 0 && p->nRegs <= (int)uVar15) {
    lVar7 = 0;
    do {
      if ((int)uVar17 <= lVar7) goto LAB_001ecb46;
      iVar20 = pVVar14->pArray[lVar7];
      if (((long)iVar20 < 0) || (p->nObjs <= iVar20)) goto LAB_001ecb27;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ecb08;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555);
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ecb08;
      pGVar3[iVar20].Value = (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * 0x55555556;
      lVar7 = lVar7 + 1;
      pVVar14 = p->vCis;
      uVar17 = (ulong)pVVar14->nSize;
      uVar10 = uVar17 - (long)p->nRegs;
    } while (lVar7 < (long)uVar10);
  }
  iVar20 = iVar19 - (int)uVar10;
  if (iVar20 != 0 && (int)uVar10 <= iVar19) {
    do {
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_001ecb08;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_001ecb08;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  if (0 < nNewPis) {
    do {
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar11 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar11)) goto LAB_001ecb08;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
      if ((pGVar11 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar11)) goto LAB_001ecb08;
      nNewPis = nNewPis + -1;
    } while (nNewPis != 0);
  }
  iVar20 = p->nRegs;
  if (0 < iVar20) {
    iVar18 = 0;
    do {
      iVar12 = p->vCis->nSize;
      uVar15 = (iVar12 - iVar20) + iVar18;
      if (((int)uVar15 < 0) || (iVar12 <= (int)uVar15)) goto LAB_001ecb46;
      iVar12 = p->vCis->pArray[uVar15];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_001ecb27;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ecb08;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * -0x55555555);
      pGVar11 = p_00->pObjs;
      if ((pGVar9 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar9)) goto LAB_001ecb08;
      pGVar3[iVar12].Value = (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2) * 0x55555556;
      iVar18 = iVar18 + 1;
      iVar20 = p->nRegs;
    } while (iVar18 < iVar20);
  }
  iVar18 = -1;
  if (iVar19 <= p->vCis->nSize - iVar20) {
LAB_001ec6da:
    Gia_ManMarkFanoutDrivers(p);
    iVar20 = p->nRegs;
    if (iVar20 < 1) {
      uVar15 = 0;
    }
    else {
      lVar7 = 0;
      uVar15 = 0;
      do {
        iVar12 = p->vCis->nSize;
        uVar10 = (ulong)(uint)(iVar12 - iVar20) + lVar7;
        iVar16 = (int)uVar10;
        if ((iVar16 < 0) || (iVar12 <= iVar16)) goto LAB_001ecb46;
        iVar12 = p->vCis->pArray[uVar10 & 0xffffffff];
        lVar13 = (long)iVar12;
        if ((lVar13 < 0) || (p->nObjs <= iVar12)) goto LAB_001ecb27;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        bVar1 = pInit[lVar7];
        if (bVar1 < 0x58) {
          if (bVar1 != 0x30) {
            if (bVar1 != 0x31) goto LAB_001ecbc2;
            if ((int)pGVar3[lVar13].Value < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            pGVar3[lVar13].Value = pGVar3[lVar13].Value ^ 1;
            uVar15 = uVar15 + 1;
          }
        }
        else {
          if ((bVar1 != 0x58) && (bVar1 != 0x78)) {
LAB_001ecbc2:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                          ,0xc5f,"Gia_Man_t *Gia_ManDupZeroUndc(Gia_Man_t *, char *, int, int, int)"
                         );
          }
          if ((pGVar3[lVar13].field_0x3 & 0x40) != 0) {
            uVar4 = *(uint *)((long)__s + lVar7 * 4);
            iVar20 = p_00->vCis->nSize;
            if (iVar20 - p_00->nRegs <= (int)uVar4) {
              __assert_fail("v < Gia_ManPiNum(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
            }
            if (((int)uVar4 < 0) || (iVar20 <= (int)uVar4)) goto LAB_001ecb46;
            iVar20 = p_00->vCis->pArray[uVar4];
            if (((long)iVar20 < 0) || (p_00->nObjs <= iVar20)) goto LAB_001ecb27;
            pGVar11 = p_00->pObjs;
            pGVar9 = (Gia_Obj_t *)((ulong)(pGVar11 + iVar20) & 0xfffffffffffffffe);
            if ((pGVar9 < pGVar11) || (pGVar11 + (uint)p_00->nObjs <= pGVar9)) goto LAB_001ecb08;
            iVar12 = (int)((ulong)((long)pGVar9 - (long)pGVar11) >> 2);
            if (iVar12 * -0x55555555 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar4 = Gia_ManAppendMux(p_00,iVar18,pGVar3[lVar13].Value,
                                     ((uint)(pGVar11 + iVar20) & 1) + iVar12 * 0x55555556);
            pGVar3[lVar13].Value = uVar4;
            iVar20 = p->nRegs;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar20);
    }
    Gia_ManCleanMark0(p);
    if (__s != (void *)0x0) {
      free(__s);
    }
    iVar20 = p->nObjs;
    if (0 < iVar20) {
      lVar7 = 8;
      lVar13 = 0;
      do {
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar10 = *(ulong *)((long)pGVar3 + lVar7 + -8);
        if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
          uVar4 = *(uint *)((long)pGVar3 +
                           lVar7 + (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3);
          if (((int)uVar4 < 0) ||
             (uVar5 = *(uint *)((long)pGVar3 +
                               lVar7 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar5 < 0)) goto LAB_001ecb65;
          iVar20 = Gia_ManAppendAnd(p_00,uVar4 ^ (uint)(uVar10 >> 0x1d) & 1,
                                    uVar5 ^ (uint)(uVar10 >> 0x3d) & 1);
          *(int *)(&pGVar3->field_0x0 + lVar7) = iVar20;
          iVar20 = p->nObjs;
        }
        lVar13 = lVar13 + 1;
        lVar7 = lVar7 + 0xc;
      } while (lVar13 < iVar20);
    }
    uVar10 = (ulong)(uint)p->nRegs;
    pVVar14 = p->vCos;
    iVar20 = pVVar14->nSize;
    if (p->nRegs < iVar20) {
      lVar7 = 0;
      do {
        if (iVar20 <= lVar7) goto LAB_001ecb46;
        iVar20 = pVVar14->pArray[lVar7];
        if (((long)iVar20 < 0) || (p->nObjs <= iVar20)) goto LAB_001ecb27;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar20;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
        goto LAB_001ecb65;
        uVar4 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                     pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                     Value);
        pGVar3->Value = uVar4;
        lVar7 = lVar7 + 1;
        uVar10 = (ulong)(uint)p->nRegs;
        pVVar14 = p->vCos;
        iVar20 = pVVar14->nSize;
      } while (lVar7 < iVar20 - p->nRegs);
    }
    iVar20 = (int)uVar10;
    if (0 < iVar20) {
      lVar7 = 0;
      do {
        iVar18 = p->vCos->nSize;
        iVar20 = (int)uVar10;
        uVar10 = (ulong)(uint)(iVar18 - iVar20) + lVar7;
        iVar12 = (int)uVar10;
        if ((iVar12 < 0) || (iVar18 <= iVar12)) {
LAB_001ecb46:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar18 = p->vCos->pArray[uVar10 & 0xffffffff];
        if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) {
LAB_001ecb27:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar18;
        uVar5 = (uint)*(ulong *)pGVar3;
        uVar4 = pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value;
        if (pInit[lVar7] == '1') {
          if ((int)uVar4 < 0) goto LAB_001ecb65;
          uVar4 = uVar4 ^ (uint)(*(ulong *)pGVar3 >> 0x1d) & 1 ^ 1;
        }
        else {
          if ((int)uVar4 < 0) {
LAB_001ecb65:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = uVar5 >> 0x1d & 1 ^ uVar4;
        }
        uVar4 = Gia_ManAppendCo(p_00,uVar4);
        pGVar3->Value = uVar4;
        lVar7 = lVar7 + 1;
        iVar20 = p->nRegs;
        uVar10 = (ulong)iVar20;
      } while (lVar7 < (long)uVar10);
    }
    iVar18 = p->vCis->nSize - iVar20;
    if (iVar18 < iVar19) {
      Gia_ManAppendCo(p_00,1);
      iVar20 = p->nRegs;
      iVar18 = p->vCis->nSize - iVar20;
    }
    Gia_ManSetRegNum(p_00,(uint)(iVar18 < iVar19) + iVar20);
    if (fVerbose != 0) {
      printf("Converted %d 1-valued FFs and %d DC-valued FFs.\n",(ulong)uVar15,
             (ulong)(uint)((iVar19 + p->nRegs) - p->vCis->nSize));
    }
    return p_00;
  }
  pGVar11 = Gia_ManAppendObj(p_00);
  uVar10 = *(ulong *)pGVar11;
  *(ulong *)pGVar11 = uVar10 | 0x9fffffff;
  *(ulong *)pGVar11 =
       uVar10 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar11) && (pGVar11 < pGVar3 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * -0x55555555);
    pGVar3 = p_00->pObjs;
    if ((pGVar3 <= pGVar11) && (pGVar11 < pGVar3 + p_00->nObjs)) {
      iVar18 = (int)((ulong)((long)pGVar11 - (long)pGVar3) >> 2) * 0x55555556;
      goto LAB_001ec6da;
    }
  }
LAB_001ecb08:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupZeroUndc( Gia_Man_t * p, char * pInit, int nNewPis, int fGiaSimple, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int CountPis = Gia_ManPiNum(p), * pPiLits;
    int i, iResetFlop = -1, Count1 = 0;
    //printf( "Using %s\n", pInit );
    // map X-valued flops into new PIs
    assert( (int)strlen(pInit) == Gia_ManRegNum(p) );
    pPiLits = ABC_FALLOC( int, Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( pInit[i] == 'x' || pInit[i] == 'X' )
            pPiLits[i] = CountPis++;
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->fGiaSimple = fGiaSimple;
    Gia_ManConst0(p)->Value = 0;
    // create primary inputs
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = Gia_ManPiNum(p); i < CountPis; i++ )
        Gia_ManAppendCi( pNew );
    // create additional primary inputs
    for ( i = 0; i < nNewPis; i++ )
        Gia_ManAppendCi( pNew );
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create reset flop output
    if ( CountPis > Gia_ManPiNum(p) )
        iResetFlop = Gia_ManAppendCi( pNew );
    // update flop outputs
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachRo( p, pObj, i )
    {
        if ( pInit[i] == '1' )
            pObj->Value = Abc_LitNot(pObj->Value), Count1++;
        else if ( pInit[i] == 'x' || pInit[i] == 'X' )
        {
            if ( pObj->fMark0 ) // only add MUX if the flop has fanout
                pObj->Value = Gia_ManAppendMux( pNew, iResetFlop, pObj->Value, Gia_Obj2Lit(pNew, Gia_ManPi(pNew, pPiLits[i])) );
        }
        else if ( pInit[i] != '0' )
            assert( 0 );
    }
    Gia_ManCleanMark0( p );
    ABC_FREE( pPiLits );
    // build internal nodes
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create POs
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create flop inputs
    Gia_ManForEachRi( p, pObj, i )
        if ( pInit[i] == '1' )
            pObj->Value = Gia_ManAppendCo( pNew, Abc_LitNot(Gia_ObjFanin0Copy(pObj)) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create reset flop input
    if ( CountPis > Gia_ManPiNum(p) )
        Gia_ManAppendCo( pNew, 1 );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) + (int)(CountPis > Gia_ManPiNum(p)) );
    if ( fVerbose )
        printf( "Converted %d 1-valued FFs and %d DC-valued FFs.\n", Count1, CountPis-Gia_ManPiNum(p) );
    return pNew;
}